

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *cctx,ZSTD_EndDirective endOp,size_t inSize)

{
  ZSTD_compressionParameters cParams;
  ZSTD_customMem cMem;
  ZSTD_CCtx_params params_00;
  uint uVar1;
  ZSTD_paramSwitch_e ZVar2;
  ZSTD_paramSwitch_e ZVar3;
  ZSTD_paramSwitch_e ZVar4;
  int iVar5;
  ZSTD_paramSwitch_e ZVar6;
  size_t sVar7;
  ZSTDMT_CCtx *pZVar8;
  long lVar9;
  long in_RDX;
  int in_ESI;
  undefined8 *puVar10;
  long in_RDI;
  undefined8 *puVar11;
  byte bVar12;
  undefined1 in_stack_00000000 [48];
  size_t err_code_2;
  U64 pledgedSrcSize;
  size_t err_code_1;
  ZSTD_cParamMode_e mode;
  size_t dictSize;
  size_t err_code;
  ZSTD_prefixDict prefixDict;
  ZSTD_CCtx_params params;
  ZSTD_compressionParameters *in_stack_fffffffffffffd88;
  ZSTD_CCtx_params *in_stack_fffffffffffffd90;
  ZSTD_CDict *in_stack_fffffffffffffd98;
  uint in_stack_fffffffffffffda4;
  ZSTD_CCtx *in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdb0 [12];
  undefined1 in_stack_fffffffffffffdbc [12];
  ZSTD_cParamMode_e in_stack_fffffffffffffdec;
  size_t in_stack_fffffffffffffdf0;
  ZSTD_CDict *in_stack_fffffffffffffdf8;
  ZSTD_dictTableLoadMethod_e in_stack_fffffffffffffe00;
  ZSTD_dictContentType_e in_stack_fffffffffffffe04;
  size_t in_stack_fffffffffffffe08;
  void *in_stack_fffffffffffffe10;
  ZSTD_CCtx *in_stack_fffffffffffffe18;
  ZSTD_CCtx_params *in_stack_fffffffffffffe40;
  U64 in_stack_fffffffffffffe48;
  ZSTD_buffered_policy_e in_stack_fffffffffffffe50;
  undefined8 local_1a8;
  undefined4 local_19c;
  undefined8 local_130;
  undefined8 local_128;
  undefined4 local_120;
  undefined8 local_f0;
  undefined4 local_e4;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ZSTD_dictContentType_e in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  void *in_stack_ffffffffffffff40;
  ZSTDMT_CCtx *in_stack_ffffffffffffff48;
  int local_a4;
  undefined1 in_stack_ffffffffffffff60 [16];
  ZSTD_paramSwitch_e in_stack_ffffffffffffff70;
  undefined1 auVar16 [12];
  undefined1 in_stack_ffffffffffffff74 [36];
  int in_stack_ffffffffffffff98;
  ZSTD_paramSwitch_e in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffffa4 [36];
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  size_t in_stack_ffffffffffffffd0;
  ZSTD_paramSwitch_e in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff8;
  
  bVar12 = 0;
  memcpy(&local_f0,(void *)(in_RDI + 0x10),0xd0);
  lVar9 = *(long *)(in_RDI + 0xe60);
  local_1a8 = *(undefined8 *)(in_RDI + 0xe68);
  sVar7 = ZSTD_initLocalDict(in_stack_fffffffffffffda8);
  uVar1 = ERR_isError(sVar7);
  if (uVar1 == 0) {
    memset((void *)(in_RDI + 0xe60),0,0x18);
    if ((lVar9 != 0) && (*(long *)(in_RDI + 0xe58) != 0)) {
      __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6898,
                    "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)")
      ;
    }
    if ((*(long *)(in_RDI + 0xe58) != 0) && (*(long *)(in_RDI + 0xe50) == 0)) {
      in_stack_ffffffffffffff3c = *(int *)(*(long *)(in_RDI + 0xe58) + 0x17b4);
    }
    if (in_ESI == 2) {
      *(long *)(in_RDI + 0x2e0) = in_RDX + 1;
    }
    ZSTD_getCParamMode(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                       (U64)in_stack_fffffffffffffd88);
    ZVar4 = (ZSTD_paramSwitch_e)in_stack_fffffffffffffd90;
    ZSTD_getCParamsFromCCtxParams
              ((ZSTD_CCtx_params *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (U64)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
    local_e4 = (undefined4)local_130;
    uVar13 = (undefined4)((ulong)local_130 >> 0x20);
    uVar14 = (undefined4)local_128;
    uVar15 = (undefined4)((ulong)local_128 >> 0x20);
    ZVar2 = ZSTD_resolveBlockSplitterMode
                      (in_stack_ffffffffffffff9c,(ZSTD_compressionParameters *)((long)&local_f0 + 4)
                      );
    ZVar3 = ZSTD_resolveEnableLdm
                      (in_stack_ffffffffffffff70,(ZSTD_compressionParameters *)((long)&local_f0 + 4)
                      );
    ZVar4 = ZSTD_resolveRowMatchFinderMode(ZVar4,in_stack_fffffffffffffd88);
    iVar5 = ZSTD_resolveExternalSequenceValidation(in_stack_ffffffffffffff98);
    sVar7 = ZSTD_resolveMaxBlockSize(in_stack_ffffffffffffffd0);
    ZVar6 = ZSTD_resolveExternalRepcodeSearch(in_stack_ffffffffffffffd8,in_stack_ffffffffffffff3c);
    if ((in_stack_ffffffffffffffc8 == 1) && (0 < local_a4)) {
      sVar7 = 0xffffffffffffffd7;
    }
    else {
      if (*(long *)(in_RDI + 0x2e0) - 1U < 0x80001) {
        local_a4 = 0;
      }
      if (local_a4 < 1) {
        lVar9 = *(long *)(in_RDI + 0x2e0);
        cParams.chainLog = in_stack_fffffffffffffda4;
        cParams.windowLog = local_120;
        cParams._8_8_ = in_stack_fffffffffffffda8;
        cParams.minMatch = in_stack_fffffffffffffdb0._0_4_;
        cParams.targetLength = in_stack_fffffffffffffdb0._4_4_;
        cParams.strategy = in_stack_fffffffffffffdb0._8_4_;
        ZSTD_checkCParams(cParams);
        uVar1 = ZSTD_isError(0x23ef47);
        if (uVar1 != 0) {
          __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x68d8,
                        "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                       );
        }
        sVar7 = ZSTD_compressBegin_internal
                          (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                           in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                           in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe50);
        uVar1 = ERR_isError(sVar7);
        if (uVar1 != 0) {
          return sVar7;
        }
        if (*(int *)(in_RDI + 300) != 0) {
          __assert_fail("cctx->appliedParams.nbWorkers == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x68de,
                        "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                       );
        }
        *(undefined8 *)(in_RDI + 0xdc8) = 0;
        *(undefined8 *)(in_RDI + 0xdd0) = 0;
        if (*(int *)(in_RDI + 0x15c) == 0) {
          *(long *)(in_RDI + 0xdd8) =
               *(long *)(in_RDI + 0x2d8) +
               (long)(int)(uint)(*(long *)(in_RDI + 0x2d8) == lVar9 + -1);
        }
        else {
          *(undefined8 *)(in_RDI + 0xdd8) = 0;
        }
        *(undefined8 *)(in_RDI + 0xdf8) = 0;
        *(undefined8 *)(in_RDI + 0xdf0) = 0;
        *(undefined4 *)(in_RDI + 0xe00) = 1;
        *(undefined4 *)(in_RDI + 0xe04) = 0;
      }
      else {
        if (*(long *)(in_RDI + 0xe78) == 0) {
          cMem._12_12_ = in_stack_fffffffffffffdbc;
          cMem._0_12_ = in_stack_fffffffffffffdb0;
          pZVar8 = ZSTDMT_createCCtx_advanced
                             (in_stack_fffffffffffffda4,cMem,*(ZSTD_threadPool **)(in_RDI + 0x360));
          *(ZSTDMT_CCtx **)(in_RDI + 0xe78) = pZVar8;
          if (*(long *)(in_RDI + 0xe78) == 0) {
            return 0xffffffffffffffc0;
          }
        }
        puVar10 = &local_f0;
        puVar11 = (undefined8 *)&stack0xfffffffffffffd88;
        for (lVar9 = 0x1a; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar11 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
          puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
        }
        params_00.cParams.searchLog = ZVar3;
        params_00.format = in_stack_ffffffffffffff60._0_4_;
        params_00.cParams.windowLog = in_stack_ffffffffffffff60._4_4_;
        params_00.cParams.chainLog = in_stack_ffffffffffffff60._8_4_;
        params_00.cParams.hashLog = in_stack_ffffffffffffff60._12_4_;
        auVar16 = in_stack_ffffffffffffff74._12_12_;
        params_00.cParams.minMatch = in_stack_ffffffffffffff74._0_4_;
        params_00.cParams.targetLength = in_stack_ffffffffffffff74._4_4_;
        params_00.cParams.strategy = in_stack_ffffffffffffff74._8_4_;
        params_00.fParams.contentSizeFlag = auVar16._0_4_;
        params_00.fParams.checksumFlag = auVar16._4_4_;
        params_00.fParams.noDictIDFlag = auVar16._8_4_;
        params_00.compressionLevel = in_stack_ffffffffffffff74._24_4_;
        params_00.forceWindow = in_stack_ffffffffffffff74._28_4_;
        params_00._52_4_ = in_stack_ffffffffffffff74._32_4_;
        params_00.targetCBlockSize._0_4_ = iVar5;
        params_00.targetCBlockSize._4_4_ = ZVar2;
        params_00.srcSizeHint = ZVar4;
        params_00.attachDictPref = in_stack_ffffffffffffffa4._0_4_;
        params_00.literalCompressionMode = in_stack_ffffffffffffffa4._4_4_;
        params_00.nbWorkers = in_stack_ffffffffffffffa4._8_4_;
        params_00.jobSize = in_stack_ffffffffffffffa4._12_8_;
        params_00.overlapLog = in_stack_ffffffffffffffa4._20_4_;
        params_00.rsyncable = in_stack_ffffffffffffffa4._24_4_;
        params_00.ldmParams.enableLdm = in_stack_ffffffffffffffa4._28_4_;
        params_00.ldmParams.hashLog = in_stack_ffffffffffffffa4._32_4_;
        params_00.ldmParams.bucketSizeLog = in_stack_ffffffffffffffc8;
        params_00.ldmParams.minMatchLength = in_stack_ffffffffffffffcc;
        params_00.ldmParams.hashRateLog = (int)sVar7;
        params_00.ldmParams.windowLog = (int)(sVar7 >> 0x20);
        params_00.enableDedicatedDictSearch = ZVar6;
        params_00.inBufferMode = in_stack_ffffffffffffffdc;
        params_00.outBufferMode = (int)in_RDX;
        params_00.blockDelimiters = (int)((ulong)in_RDX >> 0x20);
        params_00.validateSequences = in_stack_ffffffffffffffe8;
        params_00.useBlockSplitter = in_ESI;
        params_00.useRowMatchFinder = (int)in_RDI;
        params_00.deterministicRefPrefix = (int)((ulong)in_RDI >> 0x20);
        params_00.customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffff8;
        params_00._160_48_ = in_stack_00000000;
        sVar7 = ZSTDMT_initCStream_internal
                          (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           in_stack_ffffffffffffff34,(ZSTD_CDict *)CONCAT44(local_120,uVar15),
                           params_00,CONCAT44(uVar14,uVar13));
        uVar1 = ERR_isError(sVar7);
        if (uVar1 != 0) {
          return sVar7;
        }
        if (*(long *)(in_RDI + 0xe58) == 0) {
          local_19c = 0;
        }
        else {
          local_19c = *(undefined4 *)(*(long *)(in_RDI + 0xe58) + 0x17b0);
        }
        *(undefined4 *)(in_RDI + 0x280) = local_19c;
        if (*(long *)(in_RDI + 0xe58) != 0) {
          local_1a8 = *(undefined8 *)(*(long *)(in_RDI + 0xe58) + 8);
        }
        *(undefined8 *)(in_RDI + 0x288) = local_1a8;
        *(undefined8 *)(in_RDI + 0x2e8) = 0;
        *(undefined8 *)(in_RDI + 0x2f0) = 0;
        *(undefined4 *)(in_RDI + 0xe00) = 1;
        memcpy((void *)(in_RDI + 0xe0),&local_f0,0xd0);
      }
      sVar7 = 0;
    }
  }
  return sVar7;
}

Assistant:

static size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx* cctx,
                                             ZSTD_EndDirective endOp,
                                             size_t inSize)
{
    ZSTD_CCtx_params params = cctx->requestedParams;
    ZSTD_prefixDict const prefixDict = cctx->prefixDict;
    FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) , ""); /* Init the local dict if present. */
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
    assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
    if (cctx->cdict && !cctx->localDict.cdict) {
        /* Let the cdict's compression level take priority over the requested params.
         * But do not take the cdict's compression level if the "cdict" is actually a localDict
         * generated from ZSTD_initLocalDict().
         */
        params.compressionLevel = cctx->cdict->compressionLevel;
    }
    DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
    if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = inSize + 1;  /* auto-determine pledgedSrcSize */

    {   size_t const dictSize = prefixDict.dict
                ? prefixDict.dictSize
                : (cctx->cdict ? cctx->cdict->dictContentSize : 0);
        ZSTD_cParamMode_e const mode = ZSTD_getCParamMode(cctx->cdict, &params, cctx->pledgedSrcSizePlusOne - 1);
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &params, cctx->pledgedSrcSizePlusOne-1,
                dictSize, mode);
    }

    params.useBlockSplitter = ZSTD_resolveBlockSplitterMode(params.useBlockSplitter, &params.cParams);
    params.ldmParams.enableLdm = ZSTD_resolveEnableLdm(params.ldmParams.enableLdm, &params.cParams);
    params.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params.useRowMatchFinder, &params.cParams);
    params.validateSequences = ZSTD_resolveExternalSequenceValidation(params.validateSequences);
    params.maxBlockSize = ZSTD_resolveMaxBlockSize(params.maxBlockSize);
    params.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(params.searchForExternalRepcodes, params.compressionLevel);

#ifdef ZSTD_MULTITHREAD
    /* If external matchfinder is enabled, make sure to fail before checking job size (for consistency) */
    RETURN_ERROR_IF(
        params.useSequenceProducer == 1 && params.nbWorkers >= 1,
        parameter_combination_unsupported,
        "External sequence producer isn't supported with nbWorkers >= 1"
    );

    if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
        params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
    }
    if (params.nbWorkers > 0) {
#if ZSTD_TRACE
        cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
        /* mt context creation */
        if (cctx->mtctx == NULL) {
            DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                        params.nbWorkers);
            cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem, cctx->pool);
            RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation, "NULL pointer!");
        }
        /* mt compression */
        DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
        FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                    cctx->mtctx,
                    prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                    cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) , "");
        cctx->dictID = cctx->cdict ? cctx->cdict->dictID : 0;
        cctx->dictContentSize = cctx->cdict ? cctx->cdict->dictContentSize : prefixDict.dictSize;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        cctx->appliedParams = params;
    } else
#endif  /* ZSTD_MULTITHREAD */
    {   U64 const pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
        assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
        FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType, ZSTD_dtlm_fast,
                cctx->cdict,
                &params, pledgedSrcSize,
                ZSTDb_buffered) , "");
        assert(cctx->appliedParams.nbWorkers == 0);
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if (cctx->appliedParams.inBufferMode == ZSTD_bm_buffered) {
            /* for small input: avoid automatic flush on reaching end of block, since
            * it would require to add a 3-bytes null block to end frame
            */
            cctx->inBuffTarget = cctx->blockSize + (cctx->blockSize == pledgedSrcSize);
        } else {
            cctx->inBuffTarget = 0;
        }
        cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
    }
    return 0;
}